

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImDrawChannel * __thiscall
ImVector<ImDrawChannel>::erase_unsorted(ImVector<ImDrawChannel> *this,ImDrawChannel *it)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ImDrawCmd *pIVar3;
  unsigned_short *puVar4;
  ImDrawChannel *pIVar5;
  int iVar6;
  long lVar7;
  ImDrawChannel *pIVar8;
  
  pIVar5 = this->Data;
  if (pIVar5 <= it) {
    iVar6 = this->Size;
    pIVar8 = pIVar5 + iVar6;
    if (it < pIVar8) {
      lVar7 = (long)it - (long)pIVar5;
      if (it < pIVar8 + -1) {
        uVar2 = *(undefined8 *)&pIVar8[-1]._CmdBuffer;
        pIVar3 = pIVar8[-1]._CmdBuffer.Data;
        puVar4 = pIVar8[-1]._IdxBuffer.Data;
        puVar1 = (undefined8 *)((long)pIVar5 + lVar7 + 0x10);
        *puVar1 = *(undefined8 *)&pIVar8[-1]._IdxBuffer;
        puVar1[1] = puVar4;
        *(undefined8 *)((long)pIVar5 + lVar7) = uVar2;
        ((undefined8 *)((long)pIVar5 + lVar7))[1] = pIVar3;
        iVar6 = this->Size;
        pIVar5 = this->Data;
      }
      this->Size = iVar6 + -1;
      return (ImDrawChannel *)((long)pIVar5 + lVar7);
    }
  }
  __assert_fail("it >= Data && it < Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f1,"T *ImVector<ImDrawChannel>::erase_unsorted(const T *) [T = ImDrawChannel]");
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data+Size);  const ptrdiff_t off = it - Data; if (it < Data+Size-1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }